

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> * __thiscall
Parser::statements(vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>
                   *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  initializer_list<TokenType> __l;
  allocator_type local_51;
  TokenType local_50 [2];
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    local_50[0] = RightCurly;
    local_50[1] = EndOfFile;
    __l._M_len = 2;
    __l._M_array = local_50;
    std::vector<TokenType,_std::allocator<TokenType>_>::vector
              ((vector<TokenType,_std::allocator<TokenType>_> *)&stack0xffffffffffffffb8,__l,
               &local_51);
    bVar1 = matchAny(this,(vector<TokenType,_std::allocator<TokenType>_> *)&stack0xffffffffffffffb8)
    ;
    std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base
              ((_Vector_base<TokenType,_std::allocator<TokenType>_> *)&stack0xffffffffffffffb8);
    if (bVar1) break;
    statement((Parser *)&stack0xffffffffffffffb8);
    std::vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>>::
    emplace_back<std::shared_ptr<Statement>>
              ((vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>> *)
               __return_storage_ptr__,(shared_ptr<Statement> *)&stack0xffffffffffffffb8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ptr<Statement>> Parser::statements() {
    std::vector<ptr<Statement>> statList;
    while(!matchAny({ TokenType::RightCurly, TokenType::EndOfFile }))
        statList.push_back(statement());
    return statList;
}